

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall TArray<int,_int>::DoCopy(TArray<int,_int> *this,TArray<int,_int> *other)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  uint i;
  ulong uVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (int *)0x0;
  }
  else {
    piVar3 = (int *)M_Malloc_Dbg((ulong)uVar1 << 2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                                 ,0x199);
    this->Array = piVar3;
    piVar2 = other->Array;
    for (uVar4 = 0; uVar4 < this->Count; uVar4 = uVar4 + 1) {
      piVar3[uVar4] = piVar2[uVar4];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}